

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void virtual_proc_start(dill_stream c,char *subr_name,int arg_count,arg_info_list args,
                       dill_reg *arglist)

{
  private_ctx pdVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  pdVar1 = c->p;
  puVar2 = (undefined8 *)pdVar1->mach_info;
  *puVar2 = args;
  *(undefined4 *)(puVar2 + 3) = 0xffffffff;
  uVar3 = 0;
  uVar4 = (ulong)(uint)arg_count;
  if (arg_count < 1) {
    uVar4 = uVar3;
  }
  lVar5 = 4;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(int *)(&pdVar1->c_param_args->type + lVar5) = (int)uVar3;
    lVar5 = lVar5 + 0x14;
  }
  return;
}

Assistant:

extern void
virtual_proc_start(dill_stream c,
                   char* subr_name,
                   int arg_count,
                   arg_info_list args,
                   dill_reg* arglist)
{
    int i;
    virtual_mach_info vmi = (virtual_mach_info)c->p->mach_info;
    vmi->arg_info = args;
    vmi->prefix_code_start = -1;
    for (i = 0; i < arg_count; i++) {
        c->p->c_param_args[i].in_reg = i;
    }
}